

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<spirv_cross::Resource,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Resource,_8UL>::operator=
          (SmallVector<spirv_cross::Resource,_8UL> *this,
          SmallVector<spirv_cross::Resource,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Resource *pRVar3;
  Resource *pRVar4;
  undefined8 *puVar5;
  void *pvVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  clear(this);
  if ((other->super_VectorView<spirv_cross::Resource>).ptr == (Resource *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::Resource>).buffer_size);
    uVar8 = (other->super_VectorView<spirv_cross::Resource>).buffer_size;
    if (uVar8 != 0) {
      lVar10 = 0x20;
      uVar9 = 0;
      do {
        pRVar3 = (this->super_VectorView<spirv_cross::Resource>).ptr;
        puVar1 = (undefined8 *)((long)&(pRVar3->id).id + lVar10);
        pRVar4 = (other->super_VectorView<spirv_cross::Resource>).ptr;
        puVar2 = (undefined8 *)((long)&(pRVar4->id).id + lVar10);
        *(undefined4 *)((long)pRVar3 + lVar10 + -0x18) =
             *(undefined4 *)((long)pRVar4 + lVar10 + -0x18);
        *(undefined8 *)((long)pRVar3 + lVar10 + -0x20) =
             *(undefined8 *)((long)pRVar4 + lVar10 + -0x20);
        *(undefined8 **)((long)pRVar3 + lVar10 + -0x10) = puVar1;
        puVar5 = *(undefined8 **)((long)pRVar4 + lVar10 + -0x10);
        if (puVar2 == puVar5) {
          uVar7 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar7;
        }
        else {
          *(undefined8 **)((long)pRVar3 + lVar10 + -0x10) = puVar5;
          *(undefined8 *)((long)&(pRVar3->id).id + lVar10) = *puVar2;
        }
        *(undefined8 *)((long)pRVar3 + lVar10 + -8) = *(undefined8 *)((long)pRVar4 + lVar10 + -8);
        *(undefined8 **)((long)pRVar4 + lVar10 + -0x10) = puVar2;
        *(undefined8 *)((long)pRVar4 + lVar10 + -8) = 0;
        *(undefined1 *)((long)&(pRVar4->id).id + lVar10) = 0;
        pRVar3 = (other->super_VectorView<spirv_cross::Resource>).ptr;
        pvVar6 = *(void **)((long)pRVar3 + lVar10 + -0x10);
        if ((void *)((long)&(pRVar3->id).id + lVar10) != pvVar6) {
          operator_delete(pvVar6);
        }
        uVar9 = uVar9 + 1;
        uVar8 = (other->super_VectorView<spirv_cross::Resource>).buffer_size;
        lVar10 = lVar10 + 0x30;
      } while (uVar9 < uVar8);
    }
    (this->super_VectorView<spirv_cross::Resource>).buffer_size = uVar8;
    (other->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
  }
  else {
    pRVar3 = (this->super_VectorView<spirv_cross::Resource>).ptr;
    if (pRVar3 != (Resource *)&this->stack_storage) {
      free(pRVar3);
    }
    (this->super_VectorView<spirv_cross::Resource>).ptr =
         (other->super_VectorView<spirv_cross::Resource>).ptr;
    (this->super_VectorView<spirv_cross::Resource>).buffer_size =
         (other->super_VectorView<spirv_cross::Resource>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<spirv_cross::Resource>).ptr = (Resource *)0x0;
    (other->super_VectorView<spirv_cross::Resource>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}